

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void store_perfprof_run(PerfTbl *tbl,PerfProfInputUniqueId *uid,PerfProfRun *run)

{
  undefined8 uVar1;
  int iVar2;
  double dVar3;
  int iVar4;
  PerfTblEntry *pPVar5;
  long lVar6;
  undefined8 *puVar7;
  PerfProfRun *pPVar8;
  long lVar9;
  PerfTblValue *pPVar10;
  byte bVar11;
  undefined8 auStack_138 [8];
  undefined2 local_f8;
  undefined1 local_f6 [66];
  undefined1 local_b4 [66];
  undefined1 local_72 [66];
  
  bVar11 = 0;
  printf("Inserting run into table. Instance hash: %d:%s. Run ::: solver_name = %s, time = %.17g, closedProblem = %d, obj_ub = %.17g\n"
         ,(run->solution).stats[0],(run->solution).stats[1],(ulong)uid->seedidx,&uid->hash,run);
  memcpy(auStack_138,uid,0x42);
  pPVar5 = tbl->buf;
  memcpy(local_72,uid,0x42);
  pPVar5 = (PerfTblEntry *)stbds_hmget_key(pPVar5,0x2d0,local_72,0x42,0);
  tbl->buf = pPVar5;
  if ((pPVar5 == (PerfTblEntry *)0x0) || (pPVar5[-2].value.runs[7].solution.stats[2] == -NAN)) {
    memcpy(local_b4,auStack_138,0x42);
    pPVar5 = (PerfTblEntry *)stbds_hmput_key(pPVar5,0x2d0,local_b4,0x42,0);
    tbl->buf = pPVar5;
    dVar3 = pPVar5[-2].value.runs[7].solution.stats[2];
    *(undefined2 *)(pPVar5[(long)dVar3].key.uid.hash.cstr + 0x3f) = local_f8;
    puVar7 = auStack_138;
    pPVar5 = pPVar5 + (long)dVar3;
    for (lVar6 = 8; lVar6 != 0; lVar6 = lVar6 + -1) {
      uVar1 = *puVar7;
      (pPVar5->key).uid.seedidx = (char)uVar1;
      (pPVar5->key).uid.hash.cstr[0] = (char)((ulong)uVar1 >> 8);
      (pPVar5->key).uid.hash.cstr[1] = (char)((ulong)uVar1 >> 0x10);
      (pPVar5->key).uid.hash.cstr[2] = (char)((ulong)uVar1 >> 0x18);
      (pPVar5->key).uid.hash.cstr[3] = (char)((ulong)uVar1 >> 0x20);
      (pPVar5->key).uid.hash.cstr[4] = (char)((ulong)uVar1 >> 0x28);
      (pPVar5->key).uid.hash.cstr[5] = (char)((ulong)uVar1 >> 0x30);
      (pPVar5->key).uid.hash.cstr[6] = (char)((ulong)uVar1 >> 0x38);
      puVar7 = puVar7 + (ulong)bVar11 * -2 + 1;
      pPVar5 = (PerfTblEntry *)((long)pPVar5 + (ulong)bVar11 * -0x10 + 8);
    }
    memset(&tbl->buf[(long)tbl->buf[-2].value.runs[7].solution.stats[2]].value,0,0x288);
    pPVar5 = tbl->buf;
  }
  memcpy(local_f6,auStack_138,0x42);
  pPVar5 = (PerfTblEntry *)stbds_hmget_key(pPVar5,0x2d0,local_f6,0x42,0);
  tbl->buf = pPVar5;
  pPVar5 = pPVar5 + (long)pPVar5[-2].value.runs[7].solution.stats[2];
  pPVar10 = &pPVar5->value;
  iVar2 = pPVar10->num_runs;
  lVar9 = (long)iVar2;
  lVar6 = lVar9;
  iVar4 = 0;
  if (0 < lVar9) {
    do {
      pPVar5 = (PerfTblEntry *)(pPVar5->value).runs;
      iVar4 = strcmp(run->solver_name,(char *)pPVar5);
      if (iVar4 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/tools/perfprof/main.c"
                      ,0x78,
                      "void store_perfprof_run(PerfTbl *, PerfProfInputUniqueId *, PerfProfRun *)");
      }
      lVar6 = lVar6 + -1;
      iVar4 = iVar2;
    } while (lVar6 != 0);
  }
  if ((iVar4 == iVar2) && (iVar2 < 8)) {
    pPVar10->num_runs = iVar2 + 1;
    pPVar8 = pPVar10->runs + lVar9;
    for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
      *(undefined8 *)pPVar8->solver_name = *(undefined8 *)run->solver_name;
      run = (PerfProfRun *)((long)run + (ulong)bVar11 * -0x10 + 8);
      pPVar8 = (PerfProfRun *)((long)pPVar8 + ((ulong)bVar11 * -2 + 1) * 8);
    }
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/tools/perfprof/main.c"
                ,0x80,"void store_perfprof_run(PerfTbl *, PerfProfInputUniqueId *, PerfProfRun *)");
}

Assistant:

void store_perfprof_run(PerfTbl *tbl, PerfProfInputUniqueId *uid,
                        PerfProfRun *run) {
    printf("Inserting run into table. Instance hash: %d:%s. Run ::: "
           "solver_name = %s, "
           "time = %.17g, closedProblem = %d, obj_ub "
           "= %.17g\n",
           uid->seedidx, uid->hash.cstr, run->solver_name,
           run->solution.stats[PERFPROF_STAT_KIND_TIME],
           BOOL(run->solution.status & SOLVE_STATUS_CLOSED_PROBLEM),
           run->solution.stats[PERFPROF_STAT_KIND_PRIMAL_BOUND]);

    PerfTblKey key = {0};
    memcpy(&key.uid, uid, sizeof(key.uid));

    if (!hmgetp_null(tbl->buf, key)) {
        PerfTblValue zero_value = {0};
        hmput(tbl->buf, key, zero_value);
    }

    PerfTblValue *v = NULL;
    {
        PerfTblEntry *t = hmgetp(tbl->buf, key);
        assert(t);
        if (t) {
            v = &t->value;
        }
    }

    if (!v) {
        return;
    }

    int32_t i = 0;
    for (i = 0; i < v->num_runs; i++) {
        if (0 == strcmp(run->solver_name, v->runs[i].solver_name)) {
            // Need to update previous perf
            // BUT... This is an invalid case to happen
            assert(0);
            break;
        }
    }

    if (i == v->num_runs && (v->num_runs < ARRAY_LEN_i32(v->runs))) {
        v->num_runs++;
    } else {
        assert(0);
    }

    if (i < v->num_runs) {
        memcpy(&v->runs[i], run, MIN(sizeof(v->runs[i]), sizeof(*run)));
    } else {
        log_fatal("Bad internal error. Too much solvers specified in the same "
                  "batch, or internal bug!!");
        assert(0);
        abort();
    }
}